

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

int exr_set_display_window(exr_context_t ctxt,int part_index,exr_attr_box2i_t *dw)

{
  _internal_exr_part *p_Var1;
  exr_attr_box2i_t *peVar2;
  exr_result_t eVar3;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  int32_t unaff_retaddr;
  exr_attribute_type_t unaff_retaddr_00;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_context_t in_stack_00000018;
  exr_result_t rv;
  exr_attribute_t *attr;
  undefined4 in_stack_00000030;
  int local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDX == (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)0x0) {
    local_2c = (*in_RDI->report_error)(in_RDI,3,"Missing value for data window assignment");
  }
  else {
    local_2c = 0;
    if (in_RDI == (_internal_exr_context *)0x0) {
      local_2c = 2;
    }
    else {
      internal_exr_lock(in_RDI);
      if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
        internal_exr_unlock(in_RDI);
        local_2c = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
      }
      else {
        p_Var1 = in_RDI->parts[(int)in_ESI];
        if (in_RDI->mode == '\0') {
          internal_exr_unlock(in_RDI);
          local_2c = (*in_RDI->standard_error)(in_RDI,8);
        }
        else if (in_RDI->mode == '\x03') {
          internal_exr_unlock(in_RDI);
          local_2c = (*in_RDI->standard_error)(in_RDI,0x15);
        }
        else {
          if (p_Var1->displayWindow == (exr_attribute_t *)0x0) {
            local_2c = exr_attr_list_add(in_stack_00000018,(exr_attribute_list_t *)pctxt,
                                         (char *)part,unaff_retaddr_00,unaff_retaddr,
                                         (uint8_t **)
                                         CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8),
                                         (exr_attribute_t **)CONCAT44(part_index,in_stack_00000030))
            ;
          }
          else if (p_Var1->displayWindow->type != EXR_ATTR_BOX2I) {
            internal_exr_unlock(in_RDI);
            eVar3 = (*in_RDI->print_error)
                              (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                               p_Var1->displayWindow->type_name,"displayWindow");
            return eVar3;
          }
          if (local_2c == 0) {
            peVar2 = (p_Var1->displayWindow->field_6).box2i;
            (peVar2->min).field_0 = *in_RDX;
            (peVar2->max).field_0 = in_RDX[1];
            (p_Var1->display_window).min.field_0 = *in_RDX;
            (p_Var1->display_window).max.field_0 = in_RDX[1];
          }
          internal_exr_unlock(in_RDI);
        }
      }
    }
  }
  return local_2c;
}

Assistant:

exr_result_t
exr_set_display_window (
    exr_context_t ctxt, int part_index, const exr_attr_box2i_t* dw)
{
    if (!dw)
        return EXR_CTXT (ctxt)->report_error (
            EXR_CTXT (ctxt),
            EXR_ERR_INVALID_ARGUMENT,
            "Missing value for data window assignment");

    REQ_ATTR_FIND_CREATE (displayWindow, EXR_ATTR_BOX2I);
    if (rv == EXR_ERR_SUCCESS)
    {
        *(attr->box2i)       = *dw;
        part->display_window = *dw;
    }

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}